

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O1

bool __thiscall
HeadersSyncState::ValidateAndStoreRedownloadedHeader(HeadersSyncState *this,CBlockHeader *header)

{
  bool bVar1;
  int iVar2;
  Logger *pLVar3;
  _Elt_pointer pCVar4;
  uint32_t *puVar5;
  long lVar6;
  size_type sVar7;
  uint64_t uVar8;
  char *flag;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string_view source_file;
  string_view logging_function;
  uint auStackY_218 [62];
  undefined8 uStackY_120;
  undefined7 in_stack_fffffffffffffef8;
  byte in_stack_fffffffffffffeff;
  int64_t next_height;
  undefined1 local_f8 [32];
  undefined1 local_d8 [16];
  undefined1 local_c8 [12];
  uint32_t uStack_bc;
  undefined1 auStack_b8 [12];
  uint64_t local_a8;
  uint32_t local_a0;
  int32_t local_9c;
  uchar local_98 [8];
  uchar auStack_90 [8];
  uchar local_88 [8];
  uchar auStack_80 [16];
  uint32_t local_70;
  undefined8 local_6c;
  arith_uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_download_state == REDOWNLOAD) {
    next_height = this->m_redownload_buffer_last_height + 1;
    auVar11[0] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0]);
    auVar11[1] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[1] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1]);
    auVar11[2] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[2] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2]);
    auVar11[3] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[3] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3]);
    auVar11[4] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[4] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[4]);
    auVar11[5] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[5] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[5]);
    auVar11[6] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[6] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[6]);
    auVar11[7] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[7] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[7]);
    auVar11[8] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[8] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[8]);
    auVar11[9] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[9] ==
                  (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[9]);
    auVar11[10] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[10]
                   == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[10]);
    auVar11[0xb] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0xb] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar11[0xc] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0xc] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar11[0xd] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0xd] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar11[0xe] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0xe] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar11[0xf] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0xf] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar10[0] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x10]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar10[1] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x11]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar10[2] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x12]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar10[3] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x13]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar10[4] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x14]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar10[5] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x15]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar10[6] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x16]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar10[7] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x17]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar10[8] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x18]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar10[9] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems[0x19]
                  == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar10[10] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                    [0x1a] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar10[0xb] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0x1b] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar10[0xc] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0x1c] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar10[0xd] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0x1d] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar10[0xe] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0x1e] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar10[0xf] = -((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                     [0x1f] == (header->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar10 = auVar10 & auVar11;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
      pCVar4 = (this->m_redownloaded_headers).
               super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pCVar4 == (this->m_redownloaded_headers).
                    super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur) {
        puVar5 = &this->m_chain_start->nBits;
      }
      else {
        if (pCVar4 == (this->m_redownloaded_headers).
                      super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_first) {
          pCVar4 = (this->m_redownloaded_headers).
                   super__Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 10;
        }
        puVar5 = &pCVar4[-1].nBits;
      }
      bVar1 = PermittedDifficultyTransition
                        (this->m_consensus_params,next_height,*puVar5,header->nBits);
      if (bVar1) {
        uVar9 = 0;
        local_a8 = 0;
        local_a0 = 0;
        local_f8._0_16_ = (undefined1  [16])0x0;
        local_f8._16_16_ = (undefined1  [16])0x0;
        local_d8 = (undefined1  [16])0x0;
        local_c8 = SUB1612((undefined1  [16])0x0,0);
        uStack_bc = 0;
        auStack_b8 = SUB1612((undefined1  [16])0x0,4);
        local_9c = header->nVersion;
        local_98 = *(uchar (*) [8])(header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems;
        auStack_90 = *(uchar (*) [8])
                      ((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8);
        local_88 = *(uchar (*) [8])
                    ((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10);
        auStack_80._0_8_ =
             *(undefined8 *)((header->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18);
        auStack_80._8_4_ = header->nTime;
        auStack_80._12_4_ = header->nBits;
        local_70 = header->nNonce;
        local_6c._0_4_ = 0;
        local_6c._4_4_ = 0;
        GetBlockProof(&local_58,(CBlockIndex *)local_f8);
        lVar6 = 0x70;
        do {
          uVar9 = (ulong)auStackY_218[lVar6] +
                  (&((HeadersSyncState *)(&this->m_minimum_required_work + -1))->m_commit_offset)
                  [lVar6] + uVar9;
          (&((HeadersSyncState *)(&this->m_minimum_required_work + -1))->m_commit_offset)[lVar6] =
               (uint)uVar9;
          uVar9 = uVar9 >> 0x20;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x78);
        iVar2 = base_uint<256U>::CompareTo
                          (&(this->m_redownload_chain_work).super_base_uint<256U>,
                           &(this->m_minimum_required_work).super_base_uint<256U>);
        if (-1 < iVar2) {
          this->m_process_all_remaining_headers = true;
        }
        if ((this->m_process_all_remaining_headers != false) ||
           ((ulong)next_height % 0x267 != (ulong)this->m_commit_offset)) {
LAB_0087c7f3:
          std::deque<CompressedHeader,std::allocator<CompressedHeader>>::
          emplace_back<CBlockHeader_const&>
                    ((deque<CompressedHeader,std::allocator<CompressedHeader>> *)
                     &this->m_redownloaded_headers,header);
          this->m_redownload_buffer_last_height = next_height;
          CBlockHeader::GetHash((uint256 *)local_f8,header);
          *(undefined8 *)
           ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
               local_f8._16_8_;
          *(undefined8 *)
           ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
               local_f8._24_8_;
          *(undefined8 *)(this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
               = local_f8._0_8_;
          *(undefined8 *)
           ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 8) =
               local_f8._8_8_;
          bVar1 = true;
          goto LAB_0087c7ca;
        }
        sVar7 = bitdeque<32768>::size(&this->m_header_commitments);
        if (sVar7 == 0) {
          pLVar3 = LogInstance();
          bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
          if (bVar1) {
            flag = 
            "Initial headers sync aborted with peer=%d: commitment overrun at height=%i (redownload phase)\n"
            ;
            iVar2 = 0x103;
            goto LAB_0087c7bd;
          }
        }
        else {
          CBlockHeader::GetHash((uint256 *)local_f8,header);
          uVar8 = SipHashUint256((this->m_hasher).k0,(this->m_hasher).k1,(uint256 *)local_f8);
          uVar9 = (ulong)(this->m_header_commitments).m_pad_begin;
          in_stack_fffffffffffffeff =
               ((((this->m_header_commitments).m_deque.
                  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur)->super__Base_bitset<512UL>)._M_w
                [uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0;
          bitdeque<32768>::erase_front(&this->m_header_commitments,1);
          if (in_stack_fffffffffffffeff == ((byte)uVar8 & 1)) goto LAB_0087c7f3;
          pLVar3 = LogInstance();
          bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
          if (bVar1) {
            flag = 
            "Initial headers sync aborted with peer=%d: commitment mismatch at height=%i (redownload phase)\n"
            ;
            iVar2 = 0x10c;
            goto LAB_0087c7bd;
          }
        }
      }
      else {
        pLVar3 = LogInstance();
        bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
        if (bVar1) {
          flag = 
          "Initial headers sync aborted with peer=%d: invalid difficulty transition at height=%i (redownload phase)\n"
          ;
          iVar2 = 0xf0;
          goto LAB_0087c7bd;
        }
      }
    }
    else {
      pLVar3 = LogInstance();
      bVar1 = BCLog::Logger::WillLogCategoryLevel(pLVar3,NET,Debug);
      if (bVar1) {
        flag = 
        "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (redownload phase)\n"
        ;
        iVar2 = 0xe2;
LAB_0087c7bd:
        uStackY_120 = 0x87c7c4;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
        ;
        source_file._M_len = 0x58;
        logging_function._M_str = "ValidateAndStoreRedownloadedHeader";
        logging_function._M_len = 0x22;
        LogPrintf_<long,long>
                  (logging_function,source_file,iVar2,(LogFlags)flag,(int)this + 8,
                   (char *)&next_height,
                   (long *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                   (long *)next_height);
      }
    }
  }
  bVar1 = false;
LAB_0087c7ca:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool HeadersSyncState::ValidateAndStoreRedownloadedHeader(const CBlockHeader& header)
{
    Assume(m_download_state == State::REDOWNLOAD);
    if (m_download_state != State::REDOWNLOAD) return false;

    int64_t next_height = m_redownload_buffer_last_height + 1;

    // Ensure that we're working on a header that connects to the chain we're
    // downloading.
    if (header.hashPrevBlock != m_redownload_buffer_last_hash) {
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (redownload phase)\n", m_id, next_height);
        return false;
    }

    // Check that the difficulty adjustments are within our tolerance:
    uint32_t previous_nBits{0};
    if (!m_redownloaded_headers.empty()) {
        previous_nBits = m_redownloaded_headers.back().nBits;
    } else {
        previous_nBits = m_chain_start->nBits;
    }

    if (!PermittedDifficultyTransition(m_consensus_params, next_height,
                previous_nBits, header.nBits)) {
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: invalid difficulty transition at height=%i (redownload phase)\n", m_id, next_height);
        return false;
    }

    // Track work on the redownloaded chain
    m_redownload_chain_work += GetBlockProof(CBlockIndex(header));

    if (m_redownload_chain_work >= m_minimum_required_work) {
        m_process_all_remaining_headers = true;
    }

    // If we're at a header for which we previously stored a commitment, verify
    // it is correct. Failure will result in aborting download.
    // Also, don't check commitments once we've gotten to our target blockhash;
    // it's possible our peer has extended its chain between our first sync and
    // our second, and we don't want to return failure after we've seen our
    // target blockhash just because we ran out of commitments.
    if (!m_process_all_remaining_headers && next_height % HEADER_COMMITMENT_PERIOD == m_commit_offset) {
        if (m_header_commitments.size() == 0) {
            LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: commitment overrun at height=%i (redownload phase)\n", m_id, next_height);
            // Somehow our peer managed to feed us a different chain and
            // we've run out of commitments.
            return false;
        }
        bool commitment = m_hasher(header.GetHash()) & 1;
        bool expected_commitment = m_header_commitments.front();
        m_header_commitments.pop_front();
        if (commitment != expected_commitment) {
            LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: commitment mismatch at height=%i (redownload phase)\n", m_id, next_height);
            return false;
        }
    }

    // Store this header for later processing.
    m_redownloaded_headers.emplace_back(header);
    m_redownload_buffer_last_height = next_height;
    m_redownload_buffer_last_hash = header.GetHash();

    return true;
}